

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

Vec_Str_t *
Bmc_CollapseOne_int2
          (sat_solver *pSat1,sat_solver *pSat2,int nVars,int nCubeLim,int nBTLimit,int fCanon,
          int fReverse,int fVerbose)

{
  char cVar1;
  uint uVar2;
  sat_solver *s;
  uint *puVar3;
  double dVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  void *pvVar9;
  undefined8 *puVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  Vec_Int_t *p;
  Vec_Int_t *vTemp;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  size_t sVar17;
  uint uVar18;
  char *pcVar19;
  int i;
  Vec_Str_t *vSop_00;
  int iVar20;
  bool bVar21;
  int fComplete [2];
  timespec ts;
  int pLits [2];
  Vec_Str_t *vSop [2];
  sat_solver *pSat [2];
  abctime Time [2] [2];
  uint local_fc;
  ulong local_f8;
  long local_d0;
  int local_c8 [2];
  Vec_Int_t *local_c0;
  timespec local_b8;
  int local_a4;
  uint local_a0;
  lit local_9c;
  uint *local_98 [3];
  sat_solver *local_80;
  int local_74;
  uint local_70;
  uint local_6c;
  sat_solver *local_68 [2];
  long local_58 [5];
  
  local_a4 = nBTLimit;
  local_74 = fCanon;
  local_68[0] = pSat1;
  local_68[1] = pSat2;
  puVar8 = (uint *)malloc(0x10);
  puVar8[0] = 1000;
  puVar8[1] = 0;
  pvVar9 = malloc(1000);
  *(void **)(puVar8 + 2) = pvVar9;
  local_98[0] = puVar8;
  puVar10 = (undefined8 *)malloc(0x10);
  *puVar10 = 1000;
  pvVar9 = malloc(1000);
  puVar10[1] = pvVar9;
  iVar20 = nVars + 1;
  local_98[1] = (uint *)puVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (uint)nVars) {
    iVar6 = iVar20;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar6;
  lVar16 = (long)iVar6;
  if (iVar6 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar16 * 4);
  }
  pVVar11->pArray = piVar12;
  p = (Vec_Int_t *)malloc(0x10);
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar16 * 4);
  }
  p->pArray = piVar12;
  local_c0 = (Vec_Int_t *)malloc(0x10);
  local_c0->nSize = 0;
  local_c0->nCap = iVar6;
  if (iVar6 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar16 * 4);
  }
  local_c0->pArray = piVar12;
  vTemp = (Vec_Int_t *)malloc(0x10);
  vTemp->nSize = 0;
  vTemp->nCap = iVar6;
  if (iVar6 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar16 << 2);
  }
  vTemp->pArray = piVar12;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  if (fReverse == 0) {
    if (0 < nVars) {
      iVar6 = 3;
      do {
        Vec_IntPush(pVVar11,iVar6);
        iVar20 = iVar6 - nVars;
        iVar6 = iVar6 + 1;
      } while (iVar20 != 2);
    }
  }
  else if (0 < nVars) {
    do {
      Vec_IntPush(pVVar11,iVar20 + 1);
      iVar20 = iVar20 + -1;
    } while (1 < iVar20);
  }
  local_80 = (sat_solver *)(long)local_a4;
  lVar16 = 0;
  do {
    local_a0 = (uint)lVar16 | 4;
    s = local_68[lVar16];
    iVar6 = sat_solver_solve(s,(lit *)&local_a0,&local_9c,(ABC_INT64_T)local_80,0,0,0);
    if (iVar6 == 0) goto LAB_005878b7;
    if (iVar6 == -1) {
      puVar8[1] = 0;
      pcVar19 = " 1\n";
      if (lVar16 == 0) {
        pcVar19 = " 0\n";
      }
      lVar16 = 0;
      goto LAB_005877ec;
    }
    iVar6 = sat_solver_addclause(s,(lit *)&local_a0,&local_9c);
    if (iVar6 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x4f7,
                    "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                   );
    }
    puVar3 = local_98[lVar16];
    uVar15 = *puVar3;
    if (puVar3[1] == uVar15) {
      if ((int)uVar15 < 0x10) {
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar9 = malloc(0x10);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar3 + 2),0x10);
        }
        *(void **)(puVar3 + 2) = pvVar9;
        sVar17 = 0x10;
      }
      else {
        sVar17 = (ulong)uVar15 * 2;
        if ((int)sVar17 <= (int)uVar15) goto LAB_00587236;
        if (*(void **)(puVar3 + 2) == (void *)0x0) {
          pvVar9 = malloc(sVar17);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar3 + 2),sVar17);
        }
        *(void **)(puVar3 + 2) = pvVar9;
      }
      *puVar3 = (uint)sVar17;
    }
LAB_00587236:
    uVar15 = puVar3[1];
    puVar3[1] = uVar15 + 1;
    *(undefined1 *)(*(long *)(puVar3 + 2) + (long)(int)uVar15) = 0;
    lVar16 = lVar16 + 1;
  } while (lVar16 == 1);
  if (nCubeLim < 0) {
LAB_005878b7:
    local_fc = 0;
  }
  else {
    local_d0 = 0;
    local_fc = 0;
    do {
      local_f8 = 0;
      do {
        if (fVerbose != 0) {
          iVar6 = clock_gettime(3,&local_b8);
          if (iVar6 < 0) {
            local_d0 = -1;
          }
          else {
            local_d0 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
          }
        }
        local_80 = local_68[local_f8];
        piVar12 = pVVar11->pArray;
        iVar6 = pVVar11->nSize;
        lVar16 = (long)iVar6;
        if (0 < lVar16) {
          lVar13 = 0;
          do {
            local_80->polarity[piVar12[lVar13]] = '\0';
            lVar13 = lVar13 + 1;
          } while (lVar16 != lVar13);
        }
        local_58[4] = (long)*(uint *)(&DAT_009e8970 + local_f8 * 4);
        local_a0 = *(uint *)(&DAT_009e8970 + local_f8 * 4) * 2 + 1;
        iVar20 = sat_solver_solve(local_80,(lit *)&local_a0,&local_9c,0,0,0,0);
        if (fVerbose != 0) {
          iVar7 = clock_gettime(3,&local_b8);
          if (iVar7 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
          }
          local_58[local_f8 * 2] = local_58[local_f8 * 2] + (lVar13 - local_d0);
        }
        if (iVar20 == -1) {
LAB_00587787:
          local_c8[local_f8] = 1;
          break;
        }
        if (iVar20 == 0) goto LAB_00587917;
        p->nSize = 0;
        if (0 < iVar6) {
          lVar13 = 0;
          do {
            iVar6 = piVar12[lVar13];
            if (((long)iVar6 < 0) || (local_80->size <= iVar6)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            Vec_IntPush(p,(uint)(local_80->model[iVar6] != 1) + iVar6 * 2);
            lVar13 = lVar13 + 1;
          } while (lVar16 != lVar13);
        }
        if (fVerbose != 0) {
          iVar6 = clock_gettime(3,&local_b8);
          if (iVar6 < 0) {
            local_d0 = -1;
          }
          else {
            local_d0 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
          }
        }
        iVar6 = Bmc_CollapseExpand(local_68[local_f8 & 0xffffffff ^ 1],(sat_solver *)0x0,p,local_c0,
                                   vTemp,local_a4,local_74,-1);
        if (fVerbose != 0) {
          iVar20 = clock_gettime(3,&local_b8);
          if (iVar20 < 0) {
            lVar16 = -1;
          }
          else {
            lVar16 = local_b8.tv_nsec / 1000 + local_b8.tv_sec * 1000000;
          }
          local_58[local_f8 * 2 + 1] = local_58[local_f8 * 2 + 1] + (lVar16 - local_d0);
        }
        pVVar5 = local_c0;
        if (iVar6 < 0) goto LAB_00587917;
        puVar8 = local_98[local_f8];
        uVar15 = puVar8[1];
        if ((int)uVar15 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar9 = *(void **)(puVar8 + 2);
        local_70 = uVar15 - 1;
        puVar8[1] = local_70;
        uVar18 = uVar15 + nVars + 3;
        if ((int)uVar15 <= (int)uVar18) {
          uVar2 = *puVar8;
          sVar17 = (long)(int)uVar2 * 2;
          if ((int)sVar17 < (int)uVar18) {
            if ((int)uVar2 < (int)uVar18) {
              if (pvVar9 == (void *)0x0) {
                pvVar9 = malloc((long)(int)uVar18);
              }
              else {
                pvVar9 = realloc(pvVar9,(long)(int)uVar18);
              }
              sVar17 = (size_t)uVar18;
LAB_005875bd:
              *(void **)(puVar8 + 2) = pvVar9;
              *puVar8 = (uint)sVar17;
            }
          }
          else if ((int)uVar2 < (int)sVar17 && (int)uVar2 < (int)uVar18) {
            if (pvVar9 == (void *)0x0) {
              pvVar9 = malloc(sVar17);
            }
            else {
              pvVar9 = realloc(pvVar9,sVar17);
            }
            goto LAB_005875bd;
          }
          lVar16 = (long)(int)puVar8[1];
          if ((int)puVar8[1] < (int)uVar18) {
            do {
              *(undefined1 *)(*(long *)(puVar8 + 2) + lVar16) = 0x2d;
              lVar16 = lVar16 + 1;
            } while ((int)uVar18 != lVar16);
          }
          puVar8[1] = uVar18;
        }
        uVar18 = (uVar15 + nVars) - 1;
        if (((int)uVar18 < 0) || ((int)puVar8[1] <= (int)uVar18)) {
LAB_00587bd1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar14 = (ulong)uVar18;
        *(undefined1 *)(*(long *)(puVar8 + 2) + uVar14) = 0x20;
        uVar15 = uVar15 + nVars;
        if (((int)uVar15 < 0) || ((int)puVar8[1] <= (int)uVar15)) goto LAB_00587bd1;
        *(byte *)(*(long *)(puVar8 + 2) + (ulong)uVar15) = local_f8 == 0 | 0x30;
        if ((int)puVar8[1] <= (int)(uVar14 + 2)) goto LAB_00587bd1;
        *(undefined1 *)(*(long *)(puVar8 + 2) + uVar14 + 2) = 10;
        local_6c = uVar18;
        if ((int)puVar8[1] <= (int)(uVar14 + 3)) goto LAB_00587bd1;
        *(undefined1 *)(*(long *)(puVar8 + 2) + uVar14 + 3) = 0;
        vTemp->nSize = 0;
        Vec_IntPush(vTemp,(int)local_58[4] * 2);
        iVar6 = pVVar5->nSize;
        if (0 < (long)iVar6) {
          piVar12 = local_c0->pArray;
          lVar16 = 0;
          do {
            uVar15 = piVar12[lVar16];
            if (((long)(int)uVar15 < 0) || (p->nSize <= (int)uVar15)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar18 = p->pArray[(int)uVar15];
            if ((int)uVar18 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(vTemp,uVar18 ^ 1);
            if (fReverse == 0) {
              uVar15 = uVar15 + local_70;
            }
            else {
              uVar15 = ~uVar15 + local_6c;
            }
            if (((int)uVar15 < 0) || ((int)puVar8[1] <= (int)uVar15)) goto LAB_00587bd1;
            *(byte *)(*(long *)(puVar8 + 2) + (ulong)uVar15) = (byte)uVar18 & 1 ^ 0x31;
            lVar16 = lVar16 + 1;
          } while (iVar6 != lVar16);
        }
        iVar6 = sat_solver_addclause(local_80,vTemp->pArray,vTemp->pArray + vTemp->nSize);
        if (iVar6 != 1) {
          if (iVar6 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x536,
                          "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
                         );
          }
          goto LAB_00587787;
        }
        bVar21 = local_f8 == 0;
        local_f8 = local_f8 + 1;
      } while (bVar21);
    } while ((local_c8[1] == 0 && local_c8[0] == 0) &&
            (local_fc = local_fc + 1, (int)local_fc < nCubeLim || nCubeLim == 0));
  }
  goto LAB_00587917;
LAB_005877ec:
  do {
    cVar1 = pcVar19[lVar16];
    uVar15 = *puVar8;
    if (puVar8[1] == uVar15) {
      if ((int)uVar15 < 0x10) {
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar9 = malloc(0x10);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
        }
        sVar17 = 0x10;
      }
      else {
        sVar17 = (ulong)uVar15 * 2;
        if ((int)sVar17 <= (int)uVar15) goto LAB_00587845;
        if (*(void **)(puVar8 + 2) == (void *)0x0) {
          pvVar9 = malloc(sVar17);
        }
        else {
          pvVar9 = realloc(*(void **)(puVar8 + 2),sVar17);
        }
      }
      *(void **)(puVar8 + 2) = pvVar9;
      *puVar8 = (uint)sVar17;
    }
LAB_00587845:
    uVar15 = puVar8[1];
    puVar8[1] = uVar15 + 1;
    *(char *)(*(long *)(puVar8 + 2) + (long)(int)uVar15) = cVar1;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  uVar15 = *puVar8;
  if (puVar8[1] == uVar15) {
    if ((int)uVar15 < 0x10) {
      if (*(void **)(puVar8 + 2) == (void *)0x0) {
        pvVar9 = malloc(0x10);
      }
      else {
        pvVar9 = realloc(*(void **)(puVar8 + 2),0x10);
      }
      sVar17 = 0x10;
    }
    else {
      sVar17 = (ulong)uVar15 * 2;
      if ((int)sVar17 <= (int)uVar15) goto LAB_005878f4;
      if (*(void **)(puVar8 + 2) == (void *)0x0) {
        pvVar9 = malloc(sVar17);
      }
      else {
        pvVar9 = realloc(*(void **)(puVar8 + 2),sVar17);
      }
    }
    *(void **)(puVar8 + 2) = pvVar9;
    *puVar8 = (uint)sVar17;
  }
LAB_005878f4:
  uVar15 = puVar8[1];
  puVar8[1] = uVar15 + 1;
  *(undefined1 *)(*(long *)(puVar8 + 2) + (long)(int)uVar15) = 0;
  local_c8[0] = 1;
  local_fc = 0;
LAB_00587917:
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  pVVar11 = local_c0;
  if (local_c0->pArray != (int *)0x0) {
    free(local_c0->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  if (vTemp->pArray != (int *)0x0) {
    free(vTemp->pArray);
    vTemp->pArray = (int *)0x0;
  }
  free(vTemp);
  if (local_c8[1] == 0 || local_c8[0] == 0) {
    if (local_c8[0] == 0 && local_c8[1] == 0) {
      vSop_00 = (Vec_Str_t *)0x0;
    }
    else {
      vSop_00 = (Vec_Str_t *)local_98[local_c8[1]];
      local_98[local_c8[1]] = (uint *)0x0;
      if (1 < local_fc) {
        Bmc_CollapseIrredundantFull(vSop_00,vSop_00->nSize / (nVars + 3),nVars);
      }
    }
    if (fVerbose != 0) {
      printf("Processed output with %d supp vars. ",(ulong)(uint)nVars);
      if (vSop_00 == (Vec_Str_t *)0x0) {
        pcVar19 = "The resulting SOP exceeded %d cubes.\n";
        uVar14 = (ulong)(uint)nCubeLim;
      }
      else {
        pcVar19 = "The best cover contains %d cubes.\n";
        uVar14 = (long)vSop_00->nSize / (long)(nVars + 3) & 0xffffffff;
      }
      printf(pcVar19,uVar14);
      dVar4 = (double)local_58[0];
      iVar6 = (int)pcVar19;
      Abc_Print(iVar6,"%s =","Onset  minterm");
      Abc_Print(iVar6,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[1];
      Abc_Print(iVar6,"%s =","Onset  expand ");
      Abc_Print(iVar6,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[2];
      Abc_Print(iVar6,"%s =","Offset minterm");
      Abc_Print(iVar6,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
      dVar4 = (double)local_58[3];
      Abc_Print(iVar6,"%s =","Offset expand ");
      Abc_Print(iVar6,"%9.2f sec\n",SUB84(dVar4 / 1000000.0,0));
    }
    puVar8 = local_98[0];
    if (local_98[0] != (uint *)0x0) {
      if (*(void **)(local_98[0] + 2) != (void *)0x0) {
        free(*(void **)(local_98[0] + 2));
        puVar8[2] = 0;
        puVar8[3] = 0;
      }
      free(puVar8);
      local_98[0] = (uint *)0x0;
    }
    puVar8 = local_98[1];
    if (local_98[1] != (uint *)0x0) {
      if (*(void **)((long)local_98[1] + 8) != (void *)0x0) {
        free(*(void **)((long)local_98[1] + 8));
        *(undefined8 *)((long)puVar8 + 8) = 0;
      }
      free(puVar8);
    }
    return vSop_00;
  }
  __assert_fail("!fComplete[0] || !fComplete[1]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                ,0x540,
                "Vec_Str_t *Bmc_CollapseOne_int2(sat_solver *, sat_solver *, int, int, int, int, int, int)"
               );
}

Assistant:

Vec_Str_t * Bmc_CollapseOne_int2( sat_solver * pSat1, sat_solver * pSat2, int nVars, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    sat_solver * pSat[2] = { pSat1, pSat2 };
    Vec_Str_t * vSop[2]  = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vVars = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars+1 );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars+1 );
    int n, v, iVar, pLits[2], iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};
    // variables
    int iOutVar    = 2;
    int iOOVars[2] = {0, 1};
//    int iOutVar    = 1;
//    int iOOVars[2] = {sat_solver_nvars(pSat) - 5, sat_solver_nvars(pSat) - 5 + 1};

    // collect CI variables (0 = onset enable, 1 = offset enable, 2 = output)
    int iCiVarBeg = 3;
//    int iCiVarBeg = sat_solver_nvars(pSat) - 5 - nVars;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        pLits[0] = Abc_Var2Lit( iOutVar, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], pLits, pLits + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], pLits, pLits + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
            pLits[0] = Abc_Var2Lit( iOOVars[n], 1 ); // enable clauses
//            pLits[1] = Abc_Var2Lit( iOutVar, n );    // set output
//            status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
            status = sat_solver_solve( pSat[n], pLits, pLits + 1, 0, 0, 0, 0 );
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntForEachEntry( vVars, iVar, v )
                Vec_IntPush( vLits, Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar)) );
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
//            status = Bmc_CollapseExpand( pSat, NULL, vLits, vNums, vCube, nBTLimit, fCanon, Abc_Var2Lit(iOutVar, !n) );
            status = Bmc_CollapseExpand( pSat[!n], NULL, vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntPush( vCube, Abc_Var2Lit( iOOVars[n], 0 ) );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                int iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
//            status = sat_solver_addclause( pSat, Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}